

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestConfigureCommand.h
# Opt level: O2

cmCommand * __thiscall cmCTestConfigureCommand::Clone(cmCTestConfigureCommand *this)

{
  cmMakefile *pcVar1;
  cmCommand *this_00;
  
  this_00 = (cmCommand *)operator_new(200);
  cmCTestConfigureCommand((cmCTestConfigureCommand *)this_00);
  pcVar1 = (cmMakefile *)(this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTestScriptHandler
  ;
  this_00[1].super_cmObject._vptr_cmObject =
       (_func_int **)(this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  this_00[1].Makefile = pcVar1;
  return this_00;
}

Assistant:

virtual cmCommand* Clone()
    {
    cmCTestConfigureCommand* ni = new cmCTestConfigureCommand;
    ni->CTest = this->CTest;
    ni->CTestScriptHandler = this->CTestScriptHandler;
    return ni;
    }